

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

void __thiscall
capnp::PipelineBuilder<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>::
PipelineBuilder(PipelineBuilder<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
                *this,uint firstSegmentWords)

{
  PipelineBuilderPair local_40;
  uint local_14;
  PipelineBuilder<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults> *pPStack_10;
  uint firstSegmentWords_local;
  PipelineBuilder<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults> *this_local;
  
  local_14 = firstSegmentWords;
  pPStack_10 = this;
  capnp::_::newPipelineBuilder(&local_40,firstSegmentWords);
  PipelineBuilder(this,&local_40);
  capnp::_::PipelineBuilderPair::~PipelineBuilderPair(&local_40);
  return;
}

Assistant:

PipelineBuilder<T>::PipelineBuilder(uint firstSegmentWords)
    : PipelineBuilder(_::newPipelineBuilder(firstSegmentWords)) {}